

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

FoldingSetNodeIDRef __thiscall
llvm::FoldingSetNodeID::Intern(FoldingSetNodeID *this,BumpPtrAllocator *Allocator)

{
  ulong uVar1;
  FoldingSetNodeIDRef FVar2;
  
  FVar2.Data = AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::
               Allocate<unsigned_int>
                         ((AllocatorBase<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                           *)Allocator,
                          (ulong)(this->Bits).super_SmallVectorImpl<unsigned_int>.
                                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                                 super_SmallVectorTemplateCommon<unsigned_int,_void>.
                                 super_SmallVectorBase.Size);
  uVar1 = (ulong)(this->Bits).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    memmove(FVar2.Data,
            (this->Bits).super_SmallVectorImpl<unsigned_int>.
            super_SmallVectorTemplateBase<unsigned_int,_true>.
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
            uVar1 << 2);
    uVar1 = (ulong)(this->Bits).super_SmallVectorImpl<unsigned_int>.
                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                   super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  }
  FVar2.Size = uVar1;
  return FVar2;
}

Assistant:

FoldingSetNodeIDRef
FoldingSetNodeID::Intern(BumpPtrAllocator &Allocator) const {
  unsigned *New = Allocator.Allocate<unsigned>(Bits.size());
  std::uninitialized_copy(Bits.begin(), Bits.end(), New);
  return FoldingSetNodeIDRef(New, Bits.size());
}